

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int kinLsATimes(void *kinmem,N_Vector v,N_Vector z)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_28;
  KINMem local_20;
  
  iVar1 = kinLs_AccessLMem(kinmem,"kinLsATimes",&local_20,&local_28);
  if (iVar1 == 0) {
    iVar1 = (*local_28->jtimes)(v,z,local_20->kin_uu,&local_28->new_uu,local_28->jt_data);
    local_28->njtimes = local_28->njtimes + 1;
  }
  return iVar1;
}

Assistant:

int kinLsATimes(void* kinmem, N_Vector v, N_Vector z)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = kinls_mem->jtimes(v, z, kin_mem->kin_uu, &(kinls_mem->new_uu),
                             kinls_mem->jt_data);
  kinls_mem->njtimes++;
  return (retval);
}